

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferWriteTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::BufferWriteTests::init(BufferWriteTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  VerifyType verify;
  TestContext *testCtx;
  Context *pCVar2;
  _Alloc_hider name_00;
  deUint32 dVar3;
  TestNode *pTVar4;
  char *pcVar5;
  BasicBufferDataCase *pBVar6;
  TestNode *node;
  RecreateBufferDataStoreCase *pRVar7;
  SubDataToUndefinedCase *pSVar8;
  RandomBufferWriteCase *this_00;
  long lVar9;
  long lVar10;
  pointer pDVar11;
  int iVar12;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  specs_6;
  value_type local_58;
  Random rnd;
  value_type local_3c;
  
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic upload with glBufferData()");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
    dVar3 = init::bufferTargets[lVar9];
    for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
      dVar1 = *(deUint32 *)((long)init::usageHints + lVar10);
      pcVar5 = BufferTestUtil::getBufferTargetName(dVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,pcVar5,(allocator<char> *)&specs_6);
      std::operator+(&local_b0,&local_90,"_");
      pcVar5 = BufferTestUtil::getUsageHintName(dVar1);
      std::operator+(&name,&local_b0,pcVar5);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      pBVar6 = (BasicBufferDataCase *)operator_new(0xd0);
      BasicBufferDataCase::BasicBufferDataCase
                (pBVar6,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,dVar3,dVar1,0x3fc,VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar6);
      std::__cxx11::string::~string((string *)&name);
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"use",
             "Buffer uses");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar9 = 0;
  while( true ) {
    node = (TestNode *)operator_new(0x70);
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (lVar9 == 2) break;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,testCtx,init::verifyTypes[lVar9].name,
               glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(pTVar4,node);
    verify = init::verifyTypes[lVar9].verify;
    for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 4) {
      dVar3 = *(deUint32 *)((long)init::bufferTargets + lVar10);
      pcVar5 = BufferTestUtil::getBufferTargetName(dVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,pcVar5,(allocator<char> *)&local_b0);
      pBVar6 = (BasicBufferDataCase *)operator_new(0xd0);
      BasicBufferDataCase::BasicBufferDataCase
                (pBVar6,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,dVar3,0x88e4,0x2fb,verify);
      tcu::TestNode::addChild(node,(TestNode *)pBVar6);
      std::__cxx11::string::~string((string *)&name);
    }
    lVar9 = lVar9 + 1;
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,testCtx,"recreate_store",
             "Data store recreate using glBufferData()");
  tcu::TestNode::addChild((TestNode *)this,node);
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  local_b0._M_dataplus._M_p = (pointer)0x88e400008892;
  local_b0._M_string_length._0_4_ = 0x3e4;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)0x88e400008892;
  local_90._M_string_length._0_4_ = 0x3e4;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_90);
  specs_6.
  super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x88e400008892;
  specs_6.
  super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x3e4;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&specs_6);
  pRVar7 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar7,(this->super_TestCaseGroup).m_context,"identical_1",
             "Recreate with identical parameters",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)((long)(name._M_string_length - (long)name._M_dataplus._M_p) / 0xc),
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(node,(TestNode *)pRVar7);
  std::
  _Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::~_Vector_base((_Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                   *)&name);
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  local_b0._M_dataplus._M_p = (pointer)0x88e400008893;
  local_b0._M_string_length._0_4_ = 0x48;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)0x88e400008893;
  local_90._M_string_length._0_4_ = 0x48;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_90);
  specs_6.
  super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x88e400008893;
  specs_6.
  super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x48;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&specs_6);
  pRVar7 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar7,(this->super_TestCaseGroup).m_context,"identical_2",
             "Recreate with identical parameters",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)((long)(name._M_string_length - (long)name._M_dataplus._M_p) / 0xc),
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(node,(TestNode *)pRVar7);
  std::
  _Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::~_Vector_base((_Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                   *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_b0._M_dataplus._M_p = (pointer)0x88e400008892;
  local_b0._M_string_length._0_4_ = 0x1f8;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)0x88e400008893;
  local_90._M_string_length._0_4_ = 0x1f8;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_90);
  pRVar7 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar7,(this->super_TestCaseGroup).m_context,"different_target_1",
             "Recreate with different target",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)((long)(name._M_string_length - (long)name._M_dataplus._M_p) / 0xc),
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(node,(TestNode *)pRVar7);
  std::
  _Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::~_Vector_base((_Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                   *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_b0._M_dataplus._M_p = (pointer)0x88e400008893;
  local_b0._M_string_length._0_4_ = 0x2cc;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)0x88e400008892;
  local_90._M_string_length._0_4_ = 0x2cc;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_90);
  specs_6.
  super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x88e400008893;
  specs_6.
  super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x2cc;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&specs_6);
  pRVar7 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar7,(this->super_TestCaseGroup).m_context,"different_target_2",
             "Recreate with different target",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)((long)(name._M_string_length - (long)name._M_dataplus._M_p) / 0xc),
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(node,(TestNode *)pRVar7);
  std::
  _Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::~_Vector_base((_Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                   *)&name);
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  local_b0._M_dataplus._M_p = &DAT_88e000008892;
  local_b0._M_string_length._0_4_ = 0x66c;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)0x88e800008892;
  local_90._M_string_length._0_4_ = 0x66c;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_90);
  specs_6.
  super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x88e400008892;
  specs_6.
  super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x66c;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&specs_6);
  rnd.m_rnd._0_8_ = &DAT_88e000008892;
  rnd.m_rnd.z = 0x66c;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&rnd);
  pRVar7 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar7,(this->super_TestCaseGroup).m_context,"different_usage",
             "Recreate with different usage",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)((long)(name._M_string_length - (long)name._M_dataplus._M_p) / 0xc),
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(node,(TestNode *)pRVar7);
  std::
  _Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::~_Vector_base((_Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                   *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_b0._M_dataplus._M_p = &DAT_88e000008892;
  local_b0._M_string_length._0_4_ = 0x400;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_b0);
  local_90._M_dataplus._M_p = &DAT_88e000008892;
  local_90._M_string_length._0_4_ = 0xc;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_90);
  specs_6.
  super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_88e000008892;
  specs_6.
  super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xcff;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&specs_6);
  rnd.m_rnd._0_8_ = &DAT_88e000008892;
  rnd.m_rnd.z = 0x5c;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&rnd);
  local_58._0_8_ = &DAT_88e000008892;
  local_58.size = 0x305b;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,&local_58);
  local_3c._0_8_ = &DAT_88e000008892;
  local_3c.size = 0x23b;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&name,&local_3c);
  pRVar7 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar7,(this->super_TestCaseGroup).m_context,"different_size",
             "Recreate with different size",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)((long)(name._M_string_length - (long)name._M_dataplus._M_p) / 0xc),
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(node,(TestNode *)pRVar7);
  std::
  _Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ::~_Vector_base((_Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                   *)&name);
  deRandom_init(&rnd.m_rnd,0x5d71);
  iVar12 = 0;
  while (iVar12 != 4) {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
    ::vector(&specs_6,10,(allocator_type *)&name);
    for (pDVar11 = specs_6.
                   super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pDVar11 !=
        (pointer)CONCAT44(specs_6.
                          super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                          ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                          specs_6.
                          super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                          ._M_impl.super__Vector_impl_data._M_finish._0_4_); pDVar11 = pDVar11 + 1)
    {
      dVar3 = deRandom_getUint32(&rnd.m_rnd);
      pDVar11->target = init::bufferTargets[dVar3 & 1];
      dVar3 = deRandom_getUint32(&rnd.m_rnd);
      pDVar11->usage = init::usageHints[(ulong)dVar3 % 3];
      dVar3 = deRandom_getUint32(&rnd.m_rnd);
      pDVar11->size = dVar3 % 0xfff5 + 0xc;
    }
    pRVar7 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"random_",(allocator<char> *)&local_3c);
    iVar12 = iVar12 + 1;
    local_58.target = iVar12;
    de::toString<int>(&local_90,(int *)&local_58);
    std::operator+(&name,&local_b0,&local_90);
    RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
              (pRVar7,pCVar2,name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
               specs_6.
               super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (int)((CONCAT44(specs_6.
                               super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                               specs_6.
                               super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                               ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
                     (long)specs_6.
                           super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0xc),VERIFY_AS_VERTEX_ARRAY)
    ;
    tcu::TestNode::addChild(node,(TestNode *)pRVar7);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::
    _Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
    ::~_Vector_base(&specs_6.
                     super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                   );
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "basic_subdata","Basic glBufferSubData() usage");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
    dVar3 = init::bufferTargets[lVar9];
    for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
      dVar1 = *(deUint32 *)((long)init::usageHints + lVar10);
      pcVar5 = BufferTestUtil::getBufferTargetName(dVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,pcVar5,(allocator<char> *)&specs_6);
      std::operator+(&local_b0,&local_90,"_");
      pcVar5 = BufferTestUtil::getUsageHintName(dVar1);
      std::operator+(&name,&local_b0,pcVar5);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      pBVar6 = (BasicBufferDataCase *)operator_new(0xd0);
      BasicBufferDataCase::BasicBufferDataCase
                (pBVar6,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,dVar3,dVar1,0x3fc,VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar6);
      std::__cxx11::string::~string((string *)&name);
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "partial_specify","Partial buffer data specification with glBufferSubData()");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_b0._M_dataplus._M_p = (pointer)0x3e400000000;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  pSVar8 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar8,(this->super_TestCaseGroup).m_context,"whole_1",
             "Whole buffer specification with single glBufferSubData()",0x8892,0x88e4,0x3e4,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar8);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_b0._M_dataplus._M_p = (pointer)0x3e7000002d9;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)0x2d900000000;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_90);
  pSVar8 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar8,(this->super_TestCaseGroup).m_context,"whole_2",
             "Whole buffer specification with two calls",0x8893,0x88e8,0x6c0,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar8);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_b0._M_dataplus._M_p = (pointer)0x1a500000000;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)0x20b0000058d;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_90);
  specs_6.
  super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e8000001a5;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&specs_6);
  pSVar8 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar8,(this->super_TestCaseGroup).m_context,"whole_3",
             "Whole buffer specification with three calls",0x8892,0x88e0,0x798,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar8);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_b0._M_dataplus._M_p = (pointer)0x1f400000000;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)0xc8000001ad;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_90);
  specs_6.
  super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2af00000201;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&specs_6);
  pSVar8 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar8,(this->super_TestCaseGroup).m_context,"whole_4",
             "Whole buffer specification with three calls",0x8893,0x88e0,0x4b0,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar8);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_b0._M_dataplus._M_p = (pointer)0x20100000000;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  pSVar8 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar8,(this->super_TestCaseGroup).m_context,"low_1",
             "Low part of buffer specified with single call",0x8893,0x88e4,1000,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar8);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_b0._M_dataplus._M_p = (pointer)0x6200000000;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)0x1ff00000062;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_90);
  pSVar8 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar8,(this->super_TestCaseGroup).m_context,"low_2",
             "Low part of buffer specified with two calls",0x8892,0x88e4,0x3e4,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar8);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_b0._M_dataplus._M_p = (pointer)0x24f00000000;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)0x19000000173;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_90);
  pSVar8 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar8,(this->super_TestCaseGroup).m_context,"low_3",
             "Low part of buffer specified with two calls",0x8892,0x88e8,0x4b0,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar8);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_b0._M_dataplus._M_p = (pointer)0x1f4000001f4;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  pSVar8 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar8,(this->super_TestCaseGroup).m_context,"high_1",
             "High part of buffer specified with single call",0x8893,0x88e4,1000,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar8);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_b0._M_dataplus._M_p = (pointer)0x7b00000258;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)0x1dd000002d3;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_90);
  pSVar8 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar8,(this->super_TestCaseGroup).m_context,"high_2",
             "High part of buffer specified with two calls",0x8892,0x88e0,0x4b0,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar8);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_b0._M_dataplus._M_p = (pointer)0xc800000258;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)0x25700000259;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_90);
  pSVar8 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar8,(this->super_TestCaseGroup).m_context,"high_3",
             "High part of buffer specified with two calls",0x8892,0x88e0,0x4b0,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar8);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_b0._M_dataplus._M_p = (pointer)0x31f000003e8;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  pSVar8 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar8,(this->super_TestCaseGroup).m_context,"middle_1",
             "Middle part of buffer specified with single call",0x8893,0x88e0,0x9c4,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar8);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_b0._M_dataplus._M_p = (pointer)0xdc0000030c;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)0x1f4000003e8;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_90);
  pSVar8 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar8,(this->super_TestCaseGroup).m_context,"middle_2",
             "Middle part of buffer specified with two calls",0x8893,0x88e4,0x9c4,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar8);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_b0._M_dataplus._M_p = (pointer)0x1410000030c;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)0x1f5000003e8;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_90);
  pSVar8 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar8,(this->super_TestCaseGroup).m_context,"middle_3",
             "Middle part of buffer specified with two calls",0x8892,0x88e8,0x9c4,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar8);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
             "Randomized buffer data cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  iVar12 = 0;
  while (local_b0._M_dataplus._M_p._0_4_ = iVar12, iVar12 < 10) {
    this_00 = (RandomBufferWriteCase *)operator_new(0x110);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    de::toString<int>(&name,(int *)&local_b0);
    name_00 = name._M_dataplus;
    dVar3 = ::deInt32Hash((int)local_b0._M_dataplus._M_p);
    RandomBufferWriteCase::RandomBufferWriteCase
              (this_00,pCVar2,name_00._M_p,glcts::fixed_sample_locations_values + 1,dVar3);
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&name);
    iVar12 = (int)local_b0._M_dataplus._M_p + 1;
  }
  return iVar12;
}

Assistant:

void BufferWriteTests::init (void)
{
	static const deUint32 bufferTargets[] =
	{
		GL_ARRAY_BUFFER,
		GL_ELEMENT_ARRAY_BUFFER
	};

	static const deUint32 usageHints[] =
	{
		GL_STREAM_DRAW,
		GL_STATIC_DRAW,
		GL_DYNAMIC_DRAW
	};

	static const struct
	{
		const char*	name;
		VerifyType	verify;
	} verifyTypes[] =
	{
		{ "vertex_array",	VERIFY_AS_VERTEX_ARRAY	},
		{ "index_array",	VERIFY_AS_INDEX_ARRAY	}
	};

	// .basic
	{
		tcu::TestCaseGroup* const basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic upload with glBufferData()");
		addChild(basicGroup);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
		{
			for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usageHints); usageNdx++)
			{
				const deUint32		target	= bufferTargets[targetNdx];
				const deUint32		usage	= usageHints[usageNdx];
				const int			size	= 1020;
				const VerifyType	verify	= VERIFY_AS_VERTEX_ARRAY;
				const string		name	= string(getBufferTargetName(target)) + "_" + getUsageHintName(usage);

				basicGroup->addChild(new BasicBufferDataCase(m_context, name.c_str(), "", target, usage, size, verify));
			}
		}
	}

	// .use
	{
		tcu::TestCaseGroup* const useGroup = new tcu::TestCaseGroup(m_testCtx, "use", "Buffer uses");
		addChild(useGroup);

		for (int verifyNdx = 0; verifyNdx < DE_LENGTH_OF_ARRAY(verifyTypes); verifyNdx++)
		{
			tcu::TestCaseGroup* const verifyGroup = new tcu::TestCaseGroup(m_testCtx, verifyTypes[verifyNdx].name, "");
			useGroup->addChild(verifyGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				const deUint32		target	= bufferTargets[targetNdx];
				const deUint32		usage	= GL_STATIC_DRAW;
				const int			size	= 763;
				const VerifyType	verify	= verifyTypes[verifyNdx].verify;
				const string		name	= getBufferTargetName(target);

				verifyGroup->addChild(new BasicBufferDataCase(m_context, name.c_str(), "", target, usage, size, verify));
			}
		}
	}

	// .recreate_store
	{
		tcu::TestCaseGroup* const recreateStoreGroup = new tcu::TestCaseGroup(m_testCtx, "recreate_store", "Data store recreate using glBufferData()");
		addChild(recreateStoreGroup);

#define RECREATE_STORE_CASE(NAME, DESC, SPECLIST)																											\
		do {																																				\
			std::vector<DataStoreSpec> specs;																												\
			DataStoreSpecVecBuilder builder(specs);																											\
			builder SPECLIST;																																\
			recreateStoreGroup->addChild(new RecreateBufferDataStoreCase(m_context, #NAME, DESC, &specs[0], (int)specs.size(), VERIFY_AS_VERTEX_ARRAY));	\
		} while (deGetFalse())

		RECREATE_STORE_CASE(identical_1, "Recreate with identical parameters",
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996));

		RECREATE_STORE_CASE(identical_2, "Recreate with identical parameters",
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 72)
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 72)
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 72));

		RECREATE_STORE_CASE(different_target_1, "Recreate with different target",
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER,		GL_STATIC_DRAW, 504));

		RECREATE_STORE_CASE(different_target_2, "Recreate with different target",
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER,		GL_STATIC_DRAW, 716)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STATIC_DRAW, 716)
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER,		GL_STATIC_DRAW, 716));

		RECREATE_STORE_CASE(different_usage, "Recreate with different usage",
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_DYNAMIC_DRAW,	1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW,	1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	1644));

		RECREATE_STORE_CASE(different_size, "Recreate with different size",
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	1024)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	12)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	3327)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	92)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	12379)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	571));

#undef RECREATE_STORE_CASE

		// Random cases.
		{
			const int			numRandomCases		= 4;
			const int			numUploadsPerCase	= 10;
			const int			minSize				= 12;
			const int			maxSize				= 65536;
			const VerifyType	verify				= VERIFY_AS_VERTEX_ARRAY;
			de::Random			rnd					(23921);

			for (int caseNdx = 0; caseNdx < numRandomCases; caseNdx++)
			{
				vector<DataStoreSpec> specs(numUploadsPerCase);

				for (vector<DataStoreSpec>::iterator spec = specs.begin(); spec != specs.end(); spec++)
				{
					spec->target	= bufferTargets[rnd.getInt(0, DE_LENGTH_OF_ARRAY(bufferTargets)-1)];
					spec->usage		= usageHints[rnd.getInt(0, DE_LENGTH_OF_ARRAY(usageHints)-1)];
					spec->size		= rnd.getInt(minSize, maxSize);
				}

				recreateStoreGroup->addChild(new RecreateBufferDataStoreCase(m_context, (string("random_") + de::toString(caseNdx+1)).c_str(), "", &specs[0], (int)specs.size(), verify));
			}
		}
	}

	// .basic_subdata
	{
		tcu::TestCaseGroup* const basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic_subdata", "Basic glBufferSubData() usage");
		addChild(basicGroup);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
		{
			for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usageHints); usageNdx++)
			{
				const deUint32		target	= bufferTargets[targetNdx];
				const deUint32		usage	= usageHints[usageNdx];
				const int			size	= 1020;
				const VerifyType	verify	= VERIFY_AS_VERTEX_ARRAY;
				const string		name	= string(getBufferTargetName(target)) + "_" + getUsageHintName(usage);

				basicGroup->addChild(new BasicBufferDataCase(m_context, name.c_str(), "", target, usage, size, verify));
			}
		}
	}

	// .partial_specify
	{
		tcu::TestCaseGroup* const partialSpecifyGroup = new tcu::TestCaseGroup(m_testCtx, "partial_specify", "Partial buffer data specification with glBufferSubData()");
		addChild(partialSpecifyGroup);

#define PARTIAL_SPECIFY_CASE(NAME, DESC, TARGET, USAGE, SIZE, RANGELIST)																									\
		do {																																								\
			std::vector<tcu::IVec2> ranges;																																	\
			RangeVecBuilder builder(ranges);																																\
			builder RANGELIST;																																				\
			partialSpecifyGroup->addChild(new SubDataToUndefinedCase(m_context, #NAME, DESC, TARGET, USAGE, SIZE, &ranges[0], (int)ranges.size(), VERIFY_AS_VERTEX_ARRAY));	\
		} while (deGetFalse())

		PARTIAL_SPECIFY_CASE(whole_1, "Whole buffer specification with single glBufferSubData()", GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996,
			<< IVec2(0, 996));
		PARTIAL_SPECIFY_CASE(whole_2, "Whole buffer specification with two calls", GL_ELEMENT_ARRAY_BUFFER, GL_DYNAMIC_DRAW, 1728,
			<< IVec2(729, 999)
			<< IVec2(0, 729));
		PARTIAL_SPECIFY_CASE(whole_3, "Whole buffer specification with three calls", GL_ARRAY_BUFFER, GL_STREAM_DRAW, 1944,
			<< IVec2(0, 421)
			<< IVec2(1421, 523)
			<< IVec2(421, 1000));
		PARTIAL_SPECIFY_CASE(whole_4, "Whole buffer specification with three calls", GL_ELEMENT_ARRAY_BUFFER, GL_STREAM_DRAW, 1200,
			<< IVec2(0, 500)
			<< IVec2(429, 200)
			<< IVec2(513, 687));

		PARTIAL_SPECIFY_CASE(low_1, "Low part of buffer specified with single call", GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 1000,
			<< IVec2(0, 513));
		PARTIAL_SPECIFY_CASE(low_2, "Low part of buffer specified with two calls", GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996,
			<< IVec2(0, 98)
			<< IVec2(98, 511));
		PARTIAL_SPECIFY_CASE(low_3, "Low part of buffer specified with two calls", GL_ARRAY_BUFFER, GL_DYNAMIC_DRAW, 1200,
			<< IVec2(0, 591)
			<< IVec2(371, 400));

		PARTIAL_SPECIFY_CASE(high_1, "High part of buffer specified with single call", GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 1000,
			<< IVec2(500, 500));
		PARTIAL_SPECIFY_CASE(high_2, "High part of buffer specified with two calls", GL_ARRAY_BUFFER, GL_STREAM_DRAW, 1200,
			<< IVec2(600, 123)
			<< IVec2(723, 477));
		PARTIAL_SPECIFY_CASE(high_3, "High part of buffer specified with two calls", GL_ARRAY_BUFFER, GL_STREAM_DRAW, 1200,
			<< IVec2(600, 200)
			<< IVec2(601, 599));

		PARTIAL_SPECIFY_CASE(middle_1, "Middle part of buffer specified with single call", GL_ELEMENT_ARRAY_BUFFER, GL_STREAM_DRAW, 2500,
			<< IVec2(1000, 799));
		PARTIAL_SPECIFY_CASE(middle_2, "Middle part of buffer specified with two calls", GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 2500,
			<< IVec2(780, 220)
			<< IVec2(1000, 500));
		PARTIAL_SPECIFY_CASE(middle_3, "Middle part of buffer specified with two calls", GL_ARRAY_BUFFER, GL_DYNAMIC_DRAW, 2500,
			<< IVec2(780, 321)
			<< IVec2(1000, 501));

#undef PARTIAL_SPECIFY_CASE
	}

	// .random
	{
		tcu::TestCaseGroup* const randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Randomized buffer data cases");
		addChild(randomGroup);

		for (int i = 0; i < 10; i++)
			randomGroup->addChild(new RandomBufferWriteCase(m_context, de::toString(i).c_str(), "", deInt32Hash(i)));
	}
}